

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DistanceTree.h
# Opt level: O0

Point<double> * __thiscall
Parfait::DistanceTree::closestPoint
          (Point<double> *__return_storage_ptr__,DistanceTree *this,Point<double> *p)

{
  double dVar1;
  bool bVar2;
  const_reference pvVar3;
  pair<double,_int> pVar4;
  CurrentState local_118;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined1 auStack_b8 [8];
  CurrentState current_state;
  int local_54;
  double local_50;
  value_type local_48;
  undefined1 local_38 [8];
  PriorityQueue process;
  Point<double> *p_local;
  DistanceTree *this_local;
  
  process._24_8_ = p;
  std::
  priority_queue<std::pair<double,int>,std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>,std::greater<void>>
  ::priority_queue<std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>,void>
            ((priority_queue<std::pair<double,int>,std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>,std::greater<void>>
              *)local_38);
  local_50 = std::numeric_limits<double>::max();
  local_54 = 0;
  pVar4 = std::make_pair<double,int>(&local_50,&local_54);
  local_48.second = pVar4.second;
  current_state._56_8_ = pVar4.first;
  local_48.first = (double)current_state._56_8_;
  std::
  priority_queue<std::pair<double,_int>,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>,_std::greater<void>_>
  ::push((priority_queue<std::pair<double,_int>,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>,_std::greater<void>_>
          *)local_38,&local_48);
  local_c8 = *(undefined8 *)(process._24_8_ + 0x10);
  local_d8 = *(undefined8 *)process._24_8_;
  uStack_d0 = *(undefined8 *)(process._24_8_ + 8);
  CurrentState::CurrentState
            ((CurrentState *)auStack_b8,(array<double,_3UL>)*(array<double,_3UL> *)process._24_8_);
  do {
    bVar2 = std::
            priority_queue<std::pair<double,_int>,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>,_std::greater<void>_>
            ::empty((priority_queue<std::pair<double,_int>,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>,_std::greater<void>_>
                     *)local_38);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    closestPoint(&local_118,this,(Point<double> *)process._24_8_,(CurrentState *)auStack_b8,
                 (PriorityQueue *)local_38);
    current_state._41_8_ = local_118._49_8_;
    current_state.surface_location.pos._M_elems[0] = local_118.surface_location.pos._M_elems[1];
    current_state.query_point.pos._M_elems[1] = local_118.query_point.pos._M_elems[2];
    current_state.query_point.pos._M_elems[2] = local_118.surface_location.pos._M_elems[0];
    auStack_b8 = (undefined1  [8])local_118.query_point.pos._M_elems[0];
    current_state.query_point.pos._M_elems[0] = local_118.query_point.pos._M_elems[1];
    dVar1 = CurrentState::actualDistance((CurrentState *)auStack_b8);
    pvVar3 = std::
             priority_queue<std::pair<double,_int>,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>,_std::greater<void>_>
             ::top((priority_queue<std::pair<double,_int>,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>,_std::greater<void>_>
                    *)local_38);
  } while (pvVar3->first <= dVar1);
  CurrentState::surfaceLocation(__return_storage_ptr__,(CurrentState *)auStack_b8);
  std::
  priority_queue<std::pair<double,_int>,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>,_std::greater<void>_>
  ::~priority_queue((priority_queue<std::pair<double,_int>,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>,_std::greater<void>_>
                     *)local_38);
  return __return_storage_ptr__;
}

Assistant:

inline Parfait::Point<double> closestPoint(const Parfait::Point<double>& p) const {
          PriorityQueue process;
          process.push(std::make_pair(std::numeric_limits<double>::max(), 0));

          CurrentState current_state(p);

          while(not process.empty()) {
              current_state = closestPoint(p, current_state, process);
              if(current_state.actualDistance() < process.top().first) {
                  break;
              }
          }
          return current_state.surfaceLocation();
      }